

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnVector<int>::Append(ColumnVector<int> *this,ColumnRef *column)

{
  shared_ptr<clickhouse::ColumnVector<int>_> col;
  _func_int **local_20;
  
  Column::As<clickhouse::ColumnVector<int>>((Column *)&stack0xffffffffffffffe0);
  if (local_20 != (_func_int **)0x0) {
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)&this->data_,
               (const_iterator)
               (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_20[5],
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_20[6]);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void ColumnVector<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnVector<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}